

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O0

Type __thiscall wasm::WasmBinaryReader::getConcreteType(WasmBinaryReader *this)

{
  bool bVar1;
  allocator<char> local_39;
  string local_38;
  WasmBinaryReader *local_18;
  WasmBinaryReader *this_local;
  Type type;
  
  local_18 = this;
  this_local = (WasmBinaryReader *)getType(this);
  bVar1 = wasm::Type::isConcrete((Type *)&this_local);
  if (!bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_38,"non-concrete type when one expected",&local_39);
    throwError(this,&local_38);
  }
  return (Type)(uintptr_t)this_local;
}

Assistant:

Type WasmBinaryReader::getConcreteType() {
  auto type = getType();
  if (!type.isConcrete()) {
    throwError("non-concrete type when one expected");
  }
  return type;
}